

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::createFillZ(SVInt *this,bitwidth_t bitWidth,bool isSigned)

{
  uint64_t *puVar1;
  undefined8 extraout_RDX;
  SVInt SVar2;
  
  puVar1 = (uint64_t *)operator_new__((ulong)(bitWidth + 0x3f >> 2 & 0xfffffff0));
  (this->super_SVIntStorage).field_0.pVal = puVar1;
  (this->super_SVIntStorage).bitWidth = bitWidth;
  (this->super_SVIntStorage).signFlag = isSigned;
  (this->super_SVIntStorage).unknownFlag = true;
  setAllZ(this);
  SVar2.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar2.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar2.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar2.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar2.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar2.super_SVIntStorage;
}

Assistant:

SVInt SVInt::createFillZ(bitwidth_t bitWidth, bool isSigned) {
    SVInt result = SVInt::allocUninitialized(bitWidth, isSigned, true);
    result.setAllZ();
    return result;
}